

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3WalCheckpoint
              (Wal *pWal,sqlite3 *db,int eMode,_func_int_void_ptr *xBusy,void *pBusyArg,
              int sync_flags,int nBuf,u8 *zBuf,int *pnLog,int *pnCkpt)

{
  uint *puVar1;
  u16 uVar2;
  ushort uVar3;
  u32 uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  sqlite3_io_methods *psVar8;
  uint uVar9;
  Wal *pWVar10;
  uint *puVar11;
  ht_slot *aTmp;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  u32 *puVar15;
  uint uVar16;
  uint uVar17;
  sqlite3_uint64 n;
  long lVar18;
  int *piVar19;
  sqlite3 *psVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  long lVar25;
  ulong uVar26;
  int local_1c4;
  int nMerge;
  ulong local_1b0;
  ulong local_1a8;
  uint *local_1a0;
  u32 *local_198;
  uint local_18c;
  sqlite3 *local_188;
  uint *local_180;
  void *local_178;
  int isChanged;
  Wal *local_168;
  ulong local_160;
  _func_int_void_ptr *local_158;
  ht_slot *aMerge;
  uint local_144;
  ulong local_140;
  i64 nSize;
  u32 *local_130;
  uint local_128;
  ulong local_120;
  long local_118;
  long local_110;
  i64 nReq;
  int local_100 [52];
  
  isChanged = 0;
  if (pWal->readOnly != '\0') {
    return 8;
  }
  local_188 = db;
  local_1c4 = walLockExclusive(pWal,1,1);
  local_1b0 = (ulong)(uint)eMode;
  if (local_1c4 != 0) goto LAB_00160401;
  pWal->ckptLock = '\x01';
  if (eMode == 0) {
    local_1b0 = 0;
LAB_001603bb:
    local_1c4 = walIndexReadHdr(pWal,&isChanged);
    if (isChanged != 0) {
      psVar8 = pWal->pDbFd->pMethods;
      if (2 < psVar8->iVersion) {
        (*psVar8->xUnfetch)(pWal->pDbFd,0,(void *)0x0);
      }
    }
  }
  else {
    local_1c4 = walBusyLock(pWal,xBusy,pBusyArg,0,1);
    if (local_1c4 == 5) {
      local_1b0 = 0;
      xBusy = (_func_int_void_ptr *)0x0;
      goto LAB_001603bb;
    }
    if (local_1c4 == 0) {
      pWal->writeLock = '\x01';
      local_1b0 = (ulong)(uint)eMode;
      goto LAB_001603bb;
    }
    local_1b0 = (ulong)(uint)eMode;
  }
  if (local_1c4 != 0) goto LAB_00160401;
  uVar16 = (pWal->hdr).mxFrame;
  uVar2 = (pWal->hdr).szPage;
  uVar21 = CONCAT22(uVar2,uVar2) & 0x1fe00;
  if ((uVar16 == 0) || (uVar21 == nBuf)) {
    puVar15 = *pWal->apWiData;
    if (puVar15[0x18] < uVar16) {
      local_140 = (ulong)(pWal->hdr).nPage;
      local_1c4 = 0;
      local_198 = puVar15;
      local_18c = uVar21;
      local_178 = pBusyArg;
      for (lVar25 = 0; lVar25 != 4; lVar25 = lVar25 + 1) {
        uVar21 = puVar15[lVar25 + 0x1a];
        if (uVar21 < uVar16) {
          iVar14 = (int)lVar25 + 4;
          local_1c4 = walBusyLock(pWal,xBusy,local_178,iVar14,1);
          puVar15 = local_198;
          if (local_1c4 == 5) {
            xBusy = (_func_int_void_ptr *)0x0;
            uVar16 = uVar21;
          }
          else {
            if (local_1c4 != 0) {
              puVar11 = (uint *)0x0;
              goto LAB_0016099a;
            }
            local_198[lVar25 + 0x1a] = -(uint)(lVar25 != 0) | uVar16;
            walUnlockExclusive(pWal,iVar14,1);
            local_1c4 = 0;
          }
        }
      }
      if (uVar16 <= puVar15[0x18]) {
        pBusyArg = local_178;
        puVar11 = (uint *)0x0;
LAB_00160903:
        iVar14 = 0;
        if (local_1c4 != 5) {
          iVar14 = local_1c4;
        }
        goto LAB_0016090e;
      }
      uVar4 = puVar15[0x18];
      uVar21 = (pWal->hdr).mxFrame;
      uVar26 = (ulong)(uVar21 + 0x1000) + 0xffffffff021 >> 0xc;
      lVar25 = uVar26 << 0x20;
      n = (lVar25 >> 0x1b) + (ulong)uVar21 * 2 + 0x28;
      local_158 = xBusy;
      puVar11 = (uint *)sqlite3_malloc64(n);
      if (puVar11 != (uint *)0x0) {
        memset(puVar11,0,n);
        puVar11[1] = (int)uVar26 + 1;
        uVar24 = 0x1000;
        if (uVar21 < 0x1000) {
          uVar24 = uVar21;
        }
        local_120 = (ulong)uVar21;
        aTmp = (ht_slot *)sqlite3_malloc64((ulong)(uVar24 * 2));
        local_1c4 = 7;
        if (aTmp != (ht_slot *)0x0) {
          local_1c4 = 0;
        }
        local_180 = puVar11 + 2;
        lVar25 = lVar25 >> 0x20;
        local_1a0 = puVar11;
        local_168 = pWal;
        local_118 = lVar25;
        for (lVar18 = (long)((ulong)(uVar4 + 0x1001) * 0x100000 + -0xfdf00000) >> 0x20;
            (local_1c4 == 0 && (lVar18 <= lVar25)); lVar18 = lVar18 + 1) {
          local_1c4 = walHashGet(pWal,(int)lVar18,(WalHashLoc *)&nSize);
          puVar15 = local_130;
          if (local_1c4 == 0) {
            if (lVar18 == lVar25) {
              local_160 = (ulong)((int)local_120 - local_128);
            }
            else {
              local_160 = (ulong)(nSize - (long)local_130) >> 2;
            }
            local_1a8 = (long)local_180 + (ulong)local_128 * 2 + (long)(int)local_1a0[1] * 0x20;
            local_144 = local_128 + 1;
            uVar26 = 0;
            if (0 < (int)local_160) {
              uVar26 = local_160 & 0xffffffff;
            }
            for (uVar12 = 0; uVar26 != uVar12; uVar12 = uVar12 + 1) {
              *(short *)(local_1a8 + uVar12 * 2) = (short)uVar12;
            }
            nMerge = 0;
            aMerge = (ht_slot *)0x0;
            local_128 = local_144;
            local_110 = lVar18;
            memset(&nReq,0,0xd0);
            uVar21 = 0;
            for (uVar12 = 0; uVar12 != uVar26; uVar12 = uVar12 + 1) {
              nMerge = 1;
              aMerge = (ht_slot *)(local_1a8 + uVar12 * 2);
              for (uVar21 = 0; uVar13 = (ulong)uVar21, ((uint)uVar12 >> (uVar21 & 0x1f) & 1) != 0;
                  uVar21 = uVar21 + 1) {
                walMerge(puVar15,*(ht_slot **)(local_100 + uVar13 * 4),
                         local_100[(uVar13 * 2 + -1) * 2],&aMerge,&nMerge,aTmp);
              }
              *(ht_slot **)(local_100 + uVar13 * 4) = aMerge;
              local_100[(uVar13 * 2 + -1) * 2] = nMerge;
            }
            uVar12 = (ulong)(uVar21 + 1);
            piVar19 = local_100 + uVar12 * 4;
            uVar26 = local_160;
            while (uVar21 = (uint)uVar12, uVar21 < 0xd) {
              if (((uint)uVar26 >> (uVar21 & 0x1f) & 1) != 0) {
                walMerge(puVar15,*(ht_slot **)piVar19,piVar19[-2],&aMerge,&nMerge,aTmp);
                uVar26 = local_160;
              }
              piVar19 = piVar19 + 4;
              uVar12 = (ulong)(uVar21 + 1);
            }
            local_180[local_110 * 8 + 7] = local_144;
            local_180[local_110 * 8 + 6] = nMerge;
            *(ulong *)(local_180 + local_110 * 8 + 2) = local_1a8;
            *(u32 **)(local_180 + local_110 * 8 + 4) = puVar15;
            lVar18 = local_110;
            pWal = local_168;
            lVar25 = local_118;
          }
        }
        sqlite3_free(aTmp);
        xBusy = local_158;
        pBusyArg = local_178;
        if (local_1c4 == 0) {
          local_1c4 = walBusyLock(pWal,local_158,local_178,3,1);
          puVar15 = local_198;
          puVar11 = local_1a0;
          if (local_1c4 == 0) {
            uVar21 = local_198[0x18];
            local_198[0x20] = uVar16;
            local_1a8 = (ulong)local_18c;
            uVar24 = (uint)sync_flags >> 2 & 3;
            if ((uVar24 == 0) ||
               (local_1c4 = (*pWal->pWalFd->pMethods->xSync)(pWal->pWalFd,uVar24), local_1c4 == 0))
            {
              nReq = local_140 * local_1a8;
              (*pWal->pDbFd->pMethods->xFileControl)(pWal->pDbFd,0x27,(void *)0x0);
              local_1c4 = (*pWal->pDbFd->pMethods->xFileSize)(pWal->pDbFd,&nSize);
              if (local_1c4 == 0) {
                if (nSize < nReq) {
                  if ((long)(nSize + (pWal->hdr).mxFrame * local_1a8 + 0x10000) < nReq) {
                    local_1c4 = sqlite3CorruptError(0xfddd);
                  }
                  else {
                    psVar8 = local_168->pDbFd->pMethods;
                    if (psVar8 != (sqlite3_io_methods *)0x0) {
                      (*psVar8->xFileControl)(local_168->pDbFd,5,&nReq);
                    }
                    local_1c4 = 0;
                  }
                }
                else {
                  local_1c4 = 0;
                }
              }
            }
            local_160 = (ulong)(local_18c | 0x18);
            uVar23 = 0;
            psVar20 = local_188;
            puVar11 = local_180;
            while (pWVar10 = local_168, uVar9 = local_18c, iVar14 = local_1c4, local_1c4 == 0) {
              uVar5 = *local_1a0;
              uVar26 = (ulong)local_1a0[1];
              uVar17 = 0xffffffff;
LAB_00160b19:
              if (0 < (int)uVar26) {
                uVar26 = uVar26 - 1;
                puVar1 = puVar11 + uVar26 * 8;
                uVar6 = puVar11[uVar26 * 8 + 6];
                uVar22 = puVar11[uVar26 * 8];
                for (lVar25 = (long)(int)uVar22; uVar22 = uVar22 + 1, lVar25 < (int)uVar6;
                    lVar25 = lVar25 + 1) {
                  uVar3 = *(ushort *)(*(long *)(puVar1 + 2) + lVar25 * 2);
                  uVar7 = *(uint *)(*(long *)(puVar1 + 4) + (ulong)uVar3 * 4);
                  if (uVar5 < uVar7) {
                    if (uVar7 < uVar17) {
                      uVar23 = (uint)uVar3 + puVar1[7];
                      uVar17 = uVar7;
                    }
                    break;
                  }
                  *puVar1 = uVar22;
                }
                goto LAB_00160b19;
              }
              *local_1a0 = uVar17;
              if (uVar17 == 0xffffffff) {
                iVar14 = 0;
                break;
              }
              if ((psVar20->u1).isInterrupted != 0) {
                iVar14 = (uint)(psVar20->mallocFailed == '\0') * 2 + 7;
                break;
              }
              local_1c4 = 0;
              if ((((uVar21 < uVar23) && (uVar23 <= uVar16)) && (uVar17 <= (uint)local_140)) &&
                 ((iVar14 = (*local_168->pWalFd->pMethods->xRead)
                                      (local_168->pWalFd,zBuf,local_18c,
                                       (uVar23 - 1) * local_160 + 0x38), iVar14 != 0 ||
                  (iVar14 = (*pWVar10->pDbFd->pMethods->xWrite)
                                      (pWVar10->pDbFd,zBuf,uVar9,(uVar17 - 1) * local_1a8),
                  psVar20 = local_188, puVar11 = local_180, iVar14 != 0)))) break;
            }
            local_1c4 = iVar14;
            pWal = local_168;
            psVar8 = local_168->pDbFd->pMethods;
            if (psVar8 != (sqlite3_io_methods *)0x0) {
              (*psVar8->xFileControl)(local_168->pDbFd,0x25,(void *)0x0);
            }
            xBusy = local_158;
            pBusyArg = local_178;
            puVar11 = local_1a0;
            if ((local_1c4 == 0) &&
               ((uVar16 != (*pWal->apWiData)[4] ||
                ((local_1c4 = (*pWal->pDbFd->pMethods->xTruncate)
                                        (pWal->pDbFd,local_1a8 * (pWal->hdr).nPage), local_1c4 == 0
                 && ((uVar24 == 0 ||
                     (local_1c4 = (*pWal->pDbFd->pMethods->xSync)(pWal->pDbFd,uVar24),
                     local_1c4 == 0)))))))) {
              local_198[0x18] = uVar16;
              local_1c4 = 0;
            }
            walUnlockExclusive(pWal,3,1);
            puVar15 = local_198;
          }
        }
        else {
          sqlite3_free(local_1a0);
          puVar11 = (uint *)0x0;
          puVar15 = local_198;
          pBusyArg = local_178;
          xBusy = local_158;
        }
        goto LAB_00160903;
      }
      puVar11 = (uint *)0x0;
      local_1c4 = 7;
    }
    else {
      puVar11 = (uint *)0x0;
      iVar14 = 0;
LAB_0016090e:
      local_1c4 = iVar14;
      if (((((int)local_1b0 != 0) && (iVar14 == 0)) &&
          (local_1c4 = 5, (pWal->hdr).mxFrame <= puVar15[0x18])) &&
         (local_1c4 = 0, 1 < (int)local_1b0)) {
        sqlite3_randomness(4,&nReq);
        local_1c4 = walBusyLock(pWal,xBusy,pBusyArg,4,4);
        if (local_1c4 == 0) {
          local_1c4 = 0;
          if ((int)local_1b0 == 3) {
            walRestartHdr(pWal,(u32)nReq);
            local_1c4 = (*pWal->pWalFd->pMethods->xTruncate)(pWal->pWalFd,0);
          }
          walUnlockExclusive(pWal,4,4);
        }
      }
    }
LAB_0016099a:
    sqlite3_free(puVar11);
  }
  else {
    local_1c4 = sqlite3CorruptError(0x104ea);
  }
  if ((local_1c4 == 5) || (local_1c4 == 0)) {
    if (pnLog != (int *)0x0) {
      *pnLog = (pWal->hdr).mxFrame;
    }
    if (pnCkpt != (int *)0x0) {
      *pnCkpt = (*pWal->apWiData)[0x18];
    }
  }
LAB_00160401:
  if (isChanged != 0) {
    (pWal->hdr).aSalt[0] = 0;
    (pWal->hdr).aSalt[1] = 0;
    (pWal->hdr).aCksum[0] = 0;
    (pWal->hdr).aCksum[1] = 0;
    (pWal->hdr).mxFrame = 0;
    (pWal->hdr).nPage = 0;
    (pWal->hdr).aFrameCksum[0] = 0;
    (pWal->hdr).aFrameCksum[1] = 0;
    (pWal->hdr).iVersion = 0;
    (pWal->hdr).unused = 0;
    (pWal->hdr).iChange = 0;
    (pWal->hdr).isInit = '\0';
    (pWal->hdr).bigEndCksum = '\0';
    (pWal->hdr).szPage = 0;
  }
  sqlite3WalEndWriteTransaction(pWal);
  uVar26 = local_1b0;
  if (pWal->ckptLock != '\0') {
    walUnlockExclusive(pWal,1,1);
    pWal->ckptLock = '\0';
  }
  iVar14 = 5;
  if (local_1c4 != 0) {
    iVar14 = local_1c4;
  }
  if ((int)uVar26 == eMode) {
    iVar14 = local_1c4;
  }
  return iVar14;
}

Assistant:

SQLITE_PRIVATE int sqlite3WalCheckpoint(
  Wal *pWal,                      /* Wal connection */
  sqlite3 *db,                    /* Check this handle's interrupt flag */
  int eMode,                      /* PASSIVE, FULL, RESTART, or TRUNCATE */
  int (*xBusy)(void*),            /* Function to call when busy */
  void *pBusyArg,                 /* Context argument for xBusyHandler */
  int sync_flags,                 /* Flags to sync db file with (or 0) */
  int nBuf,                       /* Size of temporary buffer */
  u8 *zBuf,                       /* Temporary buffer to use */
  int *pnLog,                     /* OUT: Number of frames in WAL */
  int *pnCkpt                     /* OUT: Number of backfilled frames in WAL */
){
  int rc;                         /* Return code */
  int isChanged = 0;              /* True if a new wal-index header is loaded */
  int eMode2 = eMode;             /* Mode to pass to walCheckpoint() */
  int (*xBusy2)(void*) = xBusy;   /* Busy handler for eMode2 */

  assert( pWal->ckptLock==0 );
  assert( pWal->writeLock==0 );

  /* EVIDENCE-OF: R-62920-47450 The busy-handler callback is never invoked
  ** in the SQLITE_CHECKPOINT_PASSIVE mode. */
  assert( eMode!=SQLITE_CHECKPOINT_PASSIVE || xBusy==0 );

  if( pWal->readOnly ) return SQLITE_READONLY;
  WALTRACE(("WAL%p: checkpoint begins\n", pWal));

  /* Enable blocking locks, if possible. If blocking locks are successfully
  ** enabled, set xBusy2=0 so that the busy-handler is never invoked. */
  sqlite3WalDb(pWal, db);
  (void)walEnableBlocking(pWal);

  /* IMPLEMENTATION-OF: R-62028-47212 All calls obtain an exclusive
  ** "checkpoint" lock on the database file.
  ** EVIDENCE-OF: R-10421-19736 If any other process is running a
  ** checkpoint operation at the same time, the lock cannot be obtained and
  ** SQLITE_BUSY is returned.
  ** EVIDENCE-OF: R-53820-33897 Even if there is a busy-handler configured,
  ** it will not be invoked in this case.
  */
  rc = walLockExclusive(pWal, WAL_CKPT_LOCK, 1);
  testcase( rc==SQLITE_BUSY );
  testcase( rc!=SQLITE_OK && xBusy2!=0 );
  if( rc==SQLITE_OK ){
    pWal->ckptLock = 1;

    /* IMPLEMENTATION-OF: R-59782-36818 The SQLITE_CHECKPOINT_FULL, RESTART and
    ** TRUNCATE modes also obtain the exclusive "writer" lock on the database
    ** file.
    **
    ** EVIDENCE-OF: R-60642-04082 If the writer lock cannot be obtained
    ** immediately, and a busy-handler is configured, it is invoked and the
    ** writer lock retried until either the busy-handler returns 0 or the
    ** lock is successfully obtained.
    */
    if( eMode!=SQLITE_CHECKPOINT_PASSIVE ){
      rc = walBusyLock(pWal, xBusy2, pBusyArg, WAL_WRITE_LOCK, 1);
      if( rc==SQLITE_OK ){
        pWal->writeLock = 1;
      }else if( rc==SQLITE_BUSY ){
        eMode2 = SQLITE_CHECKPOINT_PASSIVE;
        xBusy2 = 0;
        rc = SQLITE_OK;
      }
    }
  }


  /* Read the wal-index header. */
  if( rc==SQLITE_OK ){
    walDisableBlocking(pWal);
    rc = walIndexReadHdr(pWal, &isChanged);
    (void)walEnableBlocking(pWal);
    if( isChanged && pWal->pDbFd->pMethods->iVersion>=3 ){
      sqlite3OsUnfetch(pWal->pDbFd, 0, 0);
    }
  }

  /* Copy data from the log to the database file. */
  if( rc==SQLITE_OK ){

    if( pWal->hdr.mxFrame && walPagesize(pWal)!=nBuf ){
      rc = SQLITE_CORRUPT_BKPT;
    }else{
      rc = walCheckpoint(pWal, db, eMode2, xBusy2, pBusyArg, sync_flags, zBuf);
    }

    /* If no error occurred, set the output variables. */
    if( rc==SQLITE_OK || rc==SQLITE_BUSY ){
      if( pnLog ) *pnLog = (int)pWal->hdr.mxFrame;
      if( pnCkpt ) *pnCkpt = (int)(walCkptInfo(pWal)->nBackfill);
    }
  }

  if( isChanged ){
    /* If a new wal-index header was loaded before the checkpoint was
    ** performed, then the pager-cache associated with pWal is now
    ** out of date. So zero the cached wal-index header to ensure that
    ** next time the pager opens a snapshot on this database it knows that
    ** the cache needs to be reset.
    */
    memset(&pWal->hdr, 0, sizeof(WalIndexHdr));
  }

  walDisableBlocking(pWal);
  sqlite3WalDb(pWal, 0);

  /* Release the locks. */
  sqlite3WalEndWriteTransaction(pWal);
  if( pWal->ckptLock ){
    walUnlockExclusive(pWal, WAL_CKPT_LOCK, 1);
    pWal->ckptLock = 0;
  }
  WALTRACE(("WAL%p: checkpoint %s\n", pWal, rc ? "failed" : "ok"));
#ifdef SQLITE_ENABLE_SETLK_TIMEOUT
  if( rc==SQLITE_BUSY_TIMEOUT ) rc = SQLITE_BUSY;
#endif
  return (rc==SQLITE_OK && eMode!=eMode2 ? SQLITE_BUSY : rc);
}